

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O0

void __thiscall soplex::SPxFastRT<double>::setDelta(SPxFastRT<double> *this,double newDelta)

{
  element_type *peVar1;
  long in_RDI;
  double in_XMM0_Qa;
  Real RVar2;
  SPxRatioTester<double> *in_stack_ffffffffffffff88;
  undefined8 local_10;
  
  SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff88);
  peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2b834e);
  RVar2 = Tolerances::epsilon(peVar1);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b8368);
  local_10 = in_XMM0_Qa;
  if (in_XMM0_Qa <= RVar2) {
    SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff88);
    peVar1 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b8398);
    local_10 = Tolerances::epsilon(peVar1);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b83be);
  }
  *(double *)(in_RDI + 0x20) = local_10;
  *(double *)(in_RDI + 0x48) = local_10;
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         newDelta = this->tolerances()->epsilon();

      this->delta = newDelta;
      fastDelta = newDelta;
   }